

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtx_reset(ZSTD_CCtx *cctx,ZSTD_ResetDirective reset)

{
  ZSTD_ResetDirective reset_local;
  ZSTD_CCtx *cctx_local;
  
  if ((reset == ZSTD_reset_session_only) || (reset == ZSTD_reset_session_and_parameters)) {
    cctx->streamStage = zcss_init;
    cctx->pledgedSrcSizePlusOne = 0;
  }
  if ((reset == ZSTD_reset_parameters) || (reset == ZSTD_reset_session_and_parameters)) {
    if (cctx->streamStage == zcss_init) {
      ZSTD_clearAllDicts(cctx);
      cctx_local = (ZSTD_CCtx *)ZSTD_CCtxParams_reset(&cctx->requestedParams);
    }
    else {
      cctx_local = (ZSTD_CCtx *)0xffffffffffffffc4;
    }
  }
  else {
    cctx_local = (ZSTD_CCtx *)0x0;
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_CCtx_reset(ZSTD_CCtx* cctx, ZSTD_ResetDirective reset)
{
    if ( (reset == ZSTD_reset_session_only)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
    }
    if ( (reset == ZSTD_reset_parameters)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                        "Can't reset parameters only when not in init stage.");
        ZSTD_clearAllDicts(cctx);
        return ZSTD_CCtxParams_reset(&cctx->requestedParams);
    }
    return 0;
}